

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void radau_compute(int n,double *x,double *w)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *__dest;
  ulong *puVar5;
  ostream *poVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  ulong uVar16;
  
  if (0 < n) {
    uVar9 = (ulong)(uint)n;
    dVar14 = r8_epsilon();
    uVar12 = 0;
    do {
      dVar15 = cos(((double)(int)uVar12 * 6.283185307179586) / (double)(n * 2 + -1));
      x[uVar12] = -dVar15;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
    __dest = operator_new__(uVar9 * 8);
    uVar1 = n + 1;
    puVar5 = (ulong *)operator_new__((ulong)(uVar1 * n) << 3);
    iVar4 = (n - 1U) * n;
    uVar3 = 0;
    do {
      memcpy(__dest,x,uVar9 * 8);
      uVar16 = 0x3ff0000000000000;
      uVar12 = (ulong)uVar1;
      puVar7 = puVar5;
      do {
        *puVar7 = uVar16;
        uVar16 = uVar16 ^ 0x8000000000000000;
        puVar7 = puVar7 + uVar9;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      if (n != 1) {
        uVar12 = 1;
        do {
          puVar5[uVar12] = 0x3ff0000000000000;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
        if (n != 1) {
          memcpy(puVar5 + uVar9 + 1,x + 1,(ulong)(n - 1U) << 3);
          uVar12 = 2;
          puVar7 = puVar5 + uVar9 + 1;
          puVar8 = puVar5 + 1;
          puVar10 = puVar5 + uVar9 * 2 + 1;
          do {
            iVar2 = (int)uVar12;
            lVar11 = 0;
            do {
              puVar10[lVar11] =
                   (ulong)((x[lVar11 + 1] * (double)(iVar2 * 2 + -1) * (double)puVar7[lVar11] +
                           (double)puVar8[lVar11] * (double)(1 - iVar2)) / (double)iVar2);
              lVar11 = lVar11 + 1;
            } while (uVar9 - 1 != lVar11);
            uVar12 = uVar12 + 1;
            puVar10 = puVar10 + uVar9;
            puVar8 = puVar8 + uVar9;
            puVar7 = puVar7 + uVar9;
          } while (uVar12 != uVar1);
          if (n != 1) {
            uVar12 = 1;
            do {
              dVar15 = *(double *)((long)__dest + uVar12 * 8);
              x[uVar12] = dVar15 - (((double)puVar5[(long)iVar4 + uVar12] +
                                    (double)puVar5[(uint)(n * n) + uVar12]) *
                                   ((1.0 - dVar15) / (double)n)) /
                                   ((double)puVar5[(long)iVar4 + uVar12] -
                                   (double)puVar5[(uint)(n * n) + uVar12]);
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
          }
        }
      }
      dVar15 = 0.0;
      uVar12 = 0;
      do {
        dVar15 = r8_max(dVar15,ABS(x[uVar12] - *(double *)((long)__dest + uVar12 * 8)));
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    } while ((dVar14 * 100.0 < dVar15) && (bVar13 = uVar3 < 0x18, uVar3 = uVar3 + 1, bVar13));
    *w = 2.0 / (double)(n * n);
    if (n != 1) {
      uVar12 = 1;
      do {
        dVar14 = (double)puVar5[(long)iVar4 + uVar12] * (double)n;
        w[uVar12] = (1.0 - x[uVar12]) / (dVar14 * dVar14);
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
    operator_delete__(__dest);
    operator_delete__(puVar5);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"RADAU_COMPUTE - Fatal error!\n");
  poVar6 = std::operator<<((ostream *)&std::cerr,"  Illegal value of ORDER = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,n);
  std::operator<<(poVar6,"\n");
  std::operator<<((ostream *)&std::cerr,"  ORDER must be at least 1.\n");
  exit(1);
}

Assistant:

void radau_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    RADAU_COMPUTE computes a Radau quadrature rule.
//
//  Discussion:
//
//    The Radau rule is distinguished by the fact that the left endpoint
//    (-1) is always an abscissa.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= NORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    The quadrature rule will integrate exactly all polynomials up to
//    X^(2*NORDER-2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 August 2007
//
//  Author:
//
//    Original MATLAB version by Greg von Winckel.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Claudio Canuto, Yousuff Hussaini, Alfio Quarteroni, Thomas Zang,
//    Spectral Methods in Fluid Dynamics,
//    Springer, 1993,
//    ISNB13: 978-3540522058,
//    LC: QA377.S676.
//
//    Francis Hildebrand,
//    Section 8.11,
//    Introduction to Numerical Analysis,
//    Dover, 1987,
//    ISBN13: 978-0486653631,
//    LC: QA300.H5.
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3,
//    LC: QA47.M315.
//
//  Parameters:
//
//    Input, int N, the order.  N must be at least 1.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int iterate;
  int iterate_max = 25;
  int j;
  double *p;
  const double r8_pi = 3.141592653589793;
  double temp;
  double test;
  double tolerance;
  double *xold;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "RADAU_COMPUTE - Fatal error!\n";
    std::cerr << "  Illegal value of ORDER = " << n << "\n";
    std::cerr << "  ORDER must be at least 1.\n";
    exit ( 1 );
  }

  tolerance = 100.0 * r8_epsilon ( );
//
//  Initial estimate for the abscissas is the Chebyshev-Gauss-Radau nodes.
//
  for ( i = 0; i < n; i++ )
  {
    x[i] = - cos ( 2.0 * r8_pi * double(         i ) 
                               / double( 2 * n - 1 ) );
  }
  xold = new double[n];
  p = new double[n*(n+1)];
  iterate = 0;

  do
  {
    for ( i = 0; i < n; i++ )
    {
      xold[i] = x[i];
    }

    temp = 1.0;
    for ( j = 0; j < n + 1; j++ )
    {
      p[0+j*n] = temp;
      temp = -temp;
    }

    for ( i = 1; i < n; i++ )
    {
      p[i+0*n] = 1.0;
    }
    for ( i = 1; i < n; i++ )
    {
      p[i+1*n] = x[i];
    }

    for ( j = 2; j <= n; j++ )
    {
      for ( i = 1; i < n; i++ )
      {
        p[i+j*n] = ( double( 2 * j - 1 ) * x[i] * p[i+(j-1)*n]     
                   + double(   - j + 1 ) *        p[i+(j-2)*n] ) 
                   / double(     j     );
      }
    }
    for ( i = 1; i < n; i++ )
    {
      x[i] = xold[i] - ( ( 1.0 - xold[i] ) / double( n ) ) 
        * ( p[i+(n-1)*n] + p[i+n*n] ) / ( p[i+(n-1)*n] - p[i+n*n] );
    }
    test = 0.0;
    for ( i = 0; i < n; i++ )
    {
      test = r8_max ( test, fabs ( x[i] - xold[i] ) );
    }
    iterate = iterate + 1;
  } while ( tolerance < test && iterate < iterate_max );

  w[0] = 2.0 / double( n * n );
  for ( i = 1; i < n; i++ )
  {
    w[i] = ( 1.0 - x[i] ) / pow ( double( n ) * p[i+(n-1)*n], 2 );
  }
  delete [] xold;
  delete [] p;

  return;
}